

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestCaseInfo<PushPopTest>::ParameterizedTestCaseInfo
          (ParameterizedTestCaseInfo<PushPopTest> *this,char *name,CodeLocation *code_location)

{
  string *psVar1;
  CodeLocation *in_RDX;
  char *in_RSI;
  CodeLocation *in_RDI;
  allocator local_19 [9];
  char *local_10;
  
  local_10 = in_RSI;
  ParameterizedTestCaseInfoBase::ParameterizedTestCaseInfoBase
            ((ParameterizedTestCaseInfoBase *)in_RDI);
  *(undefined ***)&in_RDI->file = &PTR__ParameterizedTestCaseInfo_001cecb0;
  psVar1 = &in_RDI->file;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&psVar1->_M_string_length,local_10,local_19);
  std::allocator<char>::~allocator((allocator<char> *)local_19);
  CodeLocation::CodeLocation(in_RDI,in_RDX);
  std::
  vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_>_>
  ::vector((vector<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>,_std::allocator<testing::internal::linked_ptr<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::TestInfo>_>_>
            *)0x163849);
  std::
  vector<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo>_>
  ::vector((vector<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo,_std::allocator<testing::internal::ParameterizedTestCaseInfo<PushPopTest>::InstantiationInfo>_>
            *)0x163857);
  return;
}

Assistant:

explicit ParameterizedTestCaseInfo(
      const char* name, CodeLocation code_location)
      : test_case_name_(name), code_location_(code_location) {}